

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_write_certificate_request(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  uchar *puVar2;
  uchar *puVar3;
  size_t __n;
  bool bVar4;
  uint local_6c;
  mbedtls_x509_crt *pmStack_68;
  int authmode;
  mbedtls_x509_crt *crt;
  uchar *end;
  uchar *p;
  uchar *buf;
  size_t sa_len;
  size_t ct_len;
  size_t total_dn_size;
  size_t dn_size;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->transform_negotiate->ciphersuite_info;
  puVar2 = ssl->out_msg;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,0x936,"=> write certificate request");
  ssl->state = ssl->state + 1;
  if (ssl->handshake->sni_authmode == 3) {
    local_6c = *(uint *)&ssl->conf->field_0x164 >> 2 & 3;
  }
  else {
    local_6c = ssl->handshake->sni_authmode;
  }
  if ((((pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK) ||
       (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK)) ||
      (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK)) ||
     ((pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK || (local_6c == 0)))) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x947,"<= skip write certificate request");
    ssl_local._4_4_ = 0;
  }
  else {
    puVar3 = ssl->out_msg;
    puVar3[5] = '\x01';
    puVar3[6] = '@';
    puVar3[4] = '\x02';
    end = puVar3 + 7;
    buf = (uchar *)0x0;
    if (ssl->minor_ver == 3) {
      ssl->handshake->verify_sig_alg = 4;
      if (ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384) {
        ssl->handshake->verify_sig_alg = 5;
      }
      puVar3[9] = (uchar)ssl->handshake->verify_sig_alg;
      puVar3[10] = '\x01';
      puVar3[0xb] = (uchar)ssl->handshake->verify_sig_alg;
      puVar3[0xc] = '\x03';
      *end = '\0';
      puVar3[8] = '\x04';
      buf = (uchar *)0x6;
      end = puVar3 + 0xd;
    }
    end = end + 2;
    if (ssl->handshake->sni_ca_chain == (mbedtls_x509_crt *)0x0) {
      pmStack_68 = ssl->conf->ca_chain;
    }
    else {
      pmStack_68 = ssl->handshake->sni_ca_chain;
    }
    ct_len = 0;
    while( true ) {
      bVar4 = false;
      if (pmStack_68 != (mbedtls_x509_crt *)0x0) {
        bVar4 = pmStack_68->version != 0;
      }
      if (!bVar4) goto LAB_001aef1a;
      __n = (pmStack_68->subject_raw).len;
      if ((puVar2 + 0x4000 < end) || ((ulong)((long)(puVar2 + 0x4000) - (long)end) < __n + 2))
      break;
      *end = (uchar)(__n >> 8);
      end[1] = (uchar)__n;
      memcpy(end + 2,(pmStack_68->subject_raw).p,__n);
      end = end + 2 + __n;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x9b8,"requested DN",end + -__n,__n);
      ct_len = __n + 2 + ct_len;
      pmStack_68 = pmStack_68->next;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x9af,"skipping CAs: buffer too short");
LAB_001aef1a:
    ssl->out_msglen = (long)end - (long)puVar3;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\r';
    ssl->out_msg[(long)(buf + 7)] = (uchar)(ct_len >> 8);
    ssl->out_msg[(long)(buf + 8)] = (uchar)ct_len;
    ssl_local._4_4_ = mbedtls_ssl_write_record(ssl);
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x9c6,"<= write certificate request");
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_certificate_request( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    size_t dn_size, total_dn_size; /* excluding length bytes */
    size_t ct_len, sa_len; /* including length bytes */
    unsigned char *buf, *p;
    const unsigned char * const end = ssl->out_msg + MBEDTLS_SSL_MAX_CONTENT_LEN;
    const mbedtls_x509_crt *crt;
    int authmode;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write certificate request" ) );

    ssl->state++;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_authmode != MBEDTLS_SSL_VERIFY_UNSET )
        authmode = ssl->handshake->sni_authmode;
    else
#endif
        authmode = ssl->conf->authmode;

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        authmode == MBEDTLS_SSL_VERIFY_NONE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate request" ) );
        return( 0 );
    }

    /*
     *     0  .   0   handshake type
     *     1  .   3   handshake length
     *     4  .   4   cert type count
     *     5  .. m-1  cert types
     *     m  .. m+1  sig alg length (TLS 1.2 only)
     *    m+1 .. n-1  SignatureAndHashAlgorithms (TLS 1.2 only)
     *     n  .. n+1  length of all DNs
     *    n+2 .. n+3  length of DN 1
     *    n+4 .. ...  Distinguished Name #1
     *    ... .. ...  length of DN 2, etc.
     */
    buf = ssl->out_msg;
    p = buf + 4;

    /*
     * Supported certificate types
     *
     *     ClientCertificateType certificate_types<1..2^8-1>;
     *     enum { (255) } ClientCertificateType;
     */
    ct_len = 0;

#if defined(MBEDTLS_RSA_C)
    p[1 + ct_len++] = MBEDTLS_SSL_CERT_TYPE_RSA_SIGN;
#endif
#if defined(MBEDTLS_ECDSA_C)
    p[1 + ct_len++] = MBEDTLS_SSL_CERT_TYPE_ECDSA_SIGN;
#endif

    p[0] = (unsigned char) ct_len++;
    p += ct_len;

    sa_len = 0;
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    /*
     * Add signature_algorithms for verify (TLS 1.2)
     *
     *     SignatureAndHashAlgorithm supported_signature_algorithms<2..2^16-2>;
     *
     *     struct {
     *           HashAlgorithm hash;
     *           SignatureAlgorithm signature;
     *     } SignatureAndHashAlgorithm;
     *
     *     enum { (255) } HashAlgorithm;
     *     enum { (255) } SignatureAlgorithm;
     */
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /*
         * Only use current running hash algorithm that is already required
         * for requested ciphersuite.
         */
        ssl->handshake->verify_sig_alg = MBEDTLS_SSL_HASH_SHA256;

        if( ssl->transform_negotiate->ciphersuite_info->mac ==
            MBEDTLS_MD_SHA384 )
        {
            ssl->handshake->verify_sig_alg = MBEDTLS_SSL_HASH_SHA384;
        }

        /*
         * Supported signature algorithms
         */
#if defined(MBEDTLS_RSA_C)
        p[2 + sa_len++] = ssl->handshake->verify_sig_alg;
        p[2 + sa_len++] = MBEDTLS_SSL_SIG_RSA;
#endif
#if defined(MBEDTLS_ECDSA_C)
        p[2 + sa_len++] = ssl->handshake->verify_sig_alg;
        p[2 + sa_len++] = MBEDTLS_SSL_SIG_ECDSA;
#endif

        p[0] = (unsigned char)( sa_len >> 8 );
        p[1] = (unsigned char)( sa_len      );
        sa_len += 2;
        p += sa_len;
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

    /*
     * DistinguishedName certificate_authorities<0..2^16-1>;
     * opaque DistinguishedName<1..2^16-1>;
     */
    p += 2;
#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_ca_chain != NULL )
        crt = ssl->handshake->sni_ca_chain;
    else
#endif
        crt = ssl->conf->ca_chain;

    total_dn_size = 0;
    while( crt != NULL && crt->version != 0 )
    {
        dn_size = crt->subject_raw.len;

        if( end < p || (size_t)( end - p ) < 2 + dn_size )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "skipping CAs: buffer too short" ) );
            break;
        }

        *p++ = (unsigned char)( dn_size >> 8 );
        *p++ = (unsigned char)( dn_size      );
        memcpy( p, crt->subject_raw.p, dn_size );
        p += dn_size;

        MBEDTLS_SSL_DEBUG_BUF( 3, "requested DN", p - dn_size, dn_size );

        total_dn_size += 2 + dn_size;
        crt = crt->next;
    }

    ssl->out_msglen  = p - buf;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CERTIFICATE_REQUEST;
    ssl->out_msg[4 + ct_len + sa_len] = (unsigned char)( total_dn_size  >> 8 );
    ssl->out_msg[5 + ct_len + sa_len] = (unsigned char)( total_dn_size       );

    ret = mbedtls_ssl_write_record( ssl );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write certificate request" ) );

    return( ret );
}